

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

shared_ptr<kratos::Port> __thiscall
kratos::DPIFunctionStmtBlock::output
          (DPIFunctionStmtBlock *this,string *name,uint32_t width,bool is_signed)

{
  undefined7 in_register_00000009;
  undefined4 in_register_00000014;
  byte in_R8B;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
  pVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_bool>
  pVar2;
  shared_ptr<kratos::Port> sVar3;
  bool local_50 [4];
  PortType local_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  byte local_25;
  int local_24;
  bool is_signed_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_20;
  uint32_t width_local;
  string *name_local;
  DPIFunctionStmtBlock *this_local;
  shared_ptr<kratos::Port> *p;
  
  local_24 = (int)CONCAT71(in_register_00000009,is_signed);
  local_25 = in_R8B & 1;
  pbStack_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_register_00000014,width);
  name_local = name;
  this_local = this;
  local_48.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)&name[10].field_2);
  pVar1 = std::
          map<std::__cxx11::string,unsigned_int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
          ::emplace<std::__cxx11::string_const&,unsigned_long>
                    ((map<std::__cxx11::string,unsigned_int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                      *)name[10].field_2._M_local_buf,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_register_00000014,width),
                     (unsigned_long *)(local_48.field_2._M_local_buf + 8));
  local_48._M_string_length = (size_type)pVar1.first._M_node;
  local_48.field_2._M_local_buf[0] = pVar1.second;
  local_48._7_1_ = 0;
  local_48._M_dataplus = (_Alloc_hider)0x1;
  local_48._1_3_ = 0;
  local_4c = Clock;
  local_50[0] = false;
  local_50[1] = false;
  local_50[2] = false;
  local_50[3] = false;
  std::
  make_shared<kratos::Port,kratos::Generator*&,kratos::PortDirection,std::__cxx11::string_const&,unsigned_int&,int,kratos::PortType,bool&>
            ((Generator **)this,(PortDirection *)(name + 7),&local_48,(uint *)pbStack_20,&local_24,
             &local_4c,local_50);
  pVar2 = std::
          map<std::__cxx11::string,std::shared_ptr<kratos::Port>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Port>>>>
          ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::Port>&>
                    ((map<std::__cxx11::string,std::shared_ptr<kratos::Port>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Port>>>>
                      *)&name[8]._M_string_length,pbStack_20,(shared_ptr<kratos::Port> *)this);
  sVar3.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = pVar2._8_8_
  ;
  sVar3.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Port>)
         sVar3.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Port> DPIFunctionStmtBlock::output(const std::string &name, uint32_t width,
                                                   bool is_signed) {
    // record the ordering
    port_ordering_.emplace(name, port_ordering_.size());
    auto p = std::make_shared<Port>(parent_, PortDirection::Out, name, width, 1, PortType::Data,
                                    is_signed);
    ports_.emplace(name, p);
    return p;
}